

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::ModuleSplitter
          (ModuleSplitter *this,Module *primary,Config *config)

{
  type pMVar1;
  Config *config_local;
  Module *primary_local;
  ModuleSplitter *this_local;
  
  this->config = config;
  initSecondary((ModuleSplitter *)&this->secondaryPtr,primary);
  this->primary = primary;
  pMVar1 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                     (&this->secondaryPtr);
  this->secondary = pMVar1;
  classifyFunctions(&this->classifiedFuncs,primary,config);
  this->primaryFuncs = &(this->classifiedFuncs).first;
  this->secondaryFuncs = &(this->classifiedFuncs).second;
  TableSlotManager::TableSlotManager(&this->tableManager,primary);
  Names::MinifiedNameGenerator::MinifiedNameGenerator(&this->minified);
  initExportedPrimaryFuncs(&this->exportedPrimaryFuncs,primary);
  std::
  map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  ::map(&this->placeholderMap);
  wasm::Name::Name(&this->internalLoadSecondaryModule);
  if ((config->jspi & 1U) != 0) {
    setupJSPI(this);
  }
  moveSecondaryFunctions(this);
  thunkExportedSecondaryFunctions(this);
  indirectReferencesToSecondaryFunctions(this);
  indirectCallsToSecondaryFunctions(this);
  exportImportCalledPrimaryFunctions(this);
  setupTablePatching(this);
  shareImportableItems(this);
  removeUnusedSecondaryElements(this);
  return;
}

Assistant:

ModuleSplitter(Module& primary, const Config& config)
    : config(config), secondaryPtr(initSecondary(primary)), primary(primary),
      secondary(*secondaryPtr),
      classifiedFuncs(classifyFunctions(primary, config)),
      primaryFuncs(classifiedFuncs.first),
      secondaryFuncs(classifiedFuncs.second), tableManager(primary),
      exportedPrimaryFuncs(initExportedPrimaryFuncs(primary)) {
    if (config.jspi) {
      setupJSPI();
    }
    moveSecondaryFunctions();
    thunkExportedSecondaryFunctions();
    indirectReferencesToSecondaryFunctions();
    indirectCallsToSecondaryFunctions();
    exportImportCalledPrimaryFunctions();
    setupTablePatching();
    shareImportableItems();
    removeUnusedSecondaryElements();
  }